

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool server::serveroption(char *arg)

{
  byte bVar1;
  int i;
  char *name;
  
  if (*arg != '-') {
    return false;
  }
  bVar1 = arg[1];
  if (bVar1 < 0x70) {
    if (bVar1 != 0x6e) {
      if (bVar1 == 0x6f) {
        i = atoi(arg + 2);
        setvar("publicserver",i,true,true);
        return true;
      }
      return false;
    }
    name = "serverdesc";
  }
  else if (bVar1 == 0x70) {
    name = "adminpass";
  }
  else {
    if (bVar1 != 0x79) {
      return false;
    }
    name = "serverpass";
  }
  setsvar(name,arg + 2,true);
  return true;
}

Assistant:

bool serveroption(const char *arg)
    {
        if(arg[0]=='-') switch(arg[1])
        {
            case 'n': setsvar("serverdesc", &arg[2]); return true;
            case 'y': setsvar("serverpass", &arg[2]); return true;
            case 'p': setsvar("adminpass", &arg[2]); return true;
            case 'o': setvar("publicserver", atoi(&arg[2])); return true;
        }
        return false;
    }